

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactMassUtil.h
# Opt level: O2

cbtVector3
gim_inertia_add_transformed
          (cbtVector3 *source_inertia,cbtVector3 *added_inertia,cbtTransform *transform)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  cbtVector3 cVar8;
  cbtMatrix3x3 rotatedTensor;
  cbtMatrix3x3 cStack_b8;
  cbtMatrix3x3 local_88;
  cbtMatrix3x3 local_58;
  
  cbtMatrix3x3::scaled(&transform->m_basis,added_inertia);
  cbtMatrix3x3::transpose(&cStack_b8,&transform->m_basis);
  operator*(&local_58,&local_88,&cStack_b8);
  fVar1 = (transform->m_origin).m_floats[2];
  uVar2 = *(undefined8 *)(transform->m_origin).m_floats;
  fVar1 = fVar1 * fVar1;
  fVar3 = (float)uVar2;
  fVar4 = (float)((ulong)uVar2 >> 0x20);
  auVar7._0_4_ = fVar3 * fVar3;
  auVar7._4_4_ = fVar4 * fVar4;
  auVar7._8_8_ = 0;
  auVar5 = vpermi2ps_avx512vl(_DAT_00f60910,(undefined1  [16])local_58.m_el._20_16_,
                              ZEXT416((uint)local_58.m_el[0].m_floats[0]));
  auVar6 = vshufps_avx(auVar7,auVar7,0xe1);
  auVar7 = vhaddps_avx(auVar7,auVar7);
  cVar8.m_floats[0] =
       auVar5._0_4_ * (auVar6._0_4_ + fVar1) + (float)*(undefined8 *)source_inertia->m_floats;
  cVar8.m_floats[1] =
       auVar5._4_4_ * (auVar6._4_4_ + fVar1) +
       (float)((ulong)*(undefined8 *)source_inertia->m_floats >> 0x20);
  auVar6._4_12_ = SUB1612(ZEXT416(0),0);
  auVar6._0_4_ = auVar7._0_4_ * local_58.m_el[2].m_floats[2] + source_inertia->m_floats[2];
  cVar8.m_floats._8_8_ = auVar6._0_8_;
  return (cbtVector3)cVar8.m_floats;
}

Assistant:

SIMD_FORCE_INLINE cbtVector3 gim_inertia_add_transformed(
	const cbtVector3& source_inertia, const cbtVector3& added_inertia, const cbtTransform& transform)
{
	cbtMatrix3x3 rotatedTensor = transform.getBasis().scaled(added_inertia) * transform.getBasis().transpose();

	cbtScalar x2 = transform.getOrigin()[0];
	x2 *= x2;
	cbtScalar y2 = transform.getOrigin()[1];
	y2 *= y2;
	cbtScalar z2 = transform.getOrigin()[2];
	z2 *= z2;

	cbtScalar ix = rotatedTensor[0][0] * (y2 + z2);
	cbtScalar iy = rotatedTensor[1][1] * (x2 + z2);
	cbtScalar iz = rotatedTensor[2][2] * (x2 + y2);

	return cbtVector3(source_inertia[0] + ix, source_inertia[1] + iy, source_inertia[2] + iz);
}